

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.cpp
# Opt level: O3

int mbedtls_rsa_import_raw
              (mbedtls_rsa_context *ctx,uchar *N,size_t N_len,uchar *P,size_t P_len,uchar *Q,
              size_t Q_len,uchar *D,size_t D_len,uchar *E,size_t E_len)

{
  int iVar1;
  size_t sVar2;
  
  if (N != (uchar *)0x0) {
    iVar1 = mbedtls_mpi_read_binary(&ctx->N,N,N_len);
    if (iVar1 != 0) goto LAB_01cebec9;
    sVar2 = mbedtls_mpi_size(&ctx->N);
    ctx->len = sVar2;
  }
  if (((P != (uchar *)0x0) && (iVar1 = mbedtls_mpi_read_binary(&ctx->P,P,P_len), iVar1 != 0)) ||
     ((Q != (uchar *)0x0 && (iVar1 = mbedtls_mpi_read_binary(&ctx->Q,Q,Q_len), iVar1 != 0))))
  goto LAB_01cebec9;
  if (D == (uchar *)0x0) {
    if (E == (uchar *)0x0) {
      return 0;
    }
LAB_01cebeb1:
    iVar1 = mbedtls_mpi_read_binary(&ctx->E,E,E_len);
  }
  else {
    iVar1 = mbedtls_mpi_read_binary(&ctx->D,D,D_len);
    if (E != (uchar *)0x0 && iVar1 == 0) goto LAB_01cebeb1;
  }
  if (iVar1 == 0) {
    return 0;
  }
LAB_01cebec9:
  return iVar1 + -0x4080;
}

Assistant:

int mbedtls_rsa_import_raw(mbedtls_rsa_context *ctx,
                           unsigned char const *N, size_t N_len,
                           unsigned char const *P, size_t P_len,
                           unsigned char const *Q, size_t Q_len,
                           unsigned char const *D, size_t D_len,
                           unsigned char const *E, size_t E_len)
{
    int ret = 0;

    if (N != NULL) {
        MBEDTLS_MPI_CHK(mbedtls_mpi_read_binary(&ctx->N, N, N_len));
        ctx->len = mbedtls_mpi_size(&ctx->N);
    }

    if (P != NULL) {
        MBEDTLS_MPI_CHK(mbedtls_mpi_read_binary(&ctx->P, P, P_len));
    }

    if (Q != NULL) {
        MBEDTLS_MPI_CHK(mbedtls_mpi_read_binary(&ctx->Q, Q, Q_len));
    }

    if (D != NULL) {
        MBEDTLS_MPI_CHK(mbedtls_mpi_read_binary(&ctx->D, D, D_len));
    }

    if (E != NULL) {
        MBEDTLS_MPI_CHK(mbedtls_mpi_read_binary(&ctx->E, E, E_len));
    }

cleanup:

    if (ret != 0) {
        return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_RSA_BAD_INPUT_DATA, ret);
    }

    return 0;
}